

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void soplex::
     LPFwriteSVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *p_svec,bool writeZeroCoefficients)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  int i;
  cpp_dec_float<200U,_int,_void> *this;
  _Ios_Iostate _Var5;
  cpp_dec_float<200U,_int,_void> *pcVar6;
  int iVar7;
  bool bVar8;
  byte bVar9;
  char name [16];
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  coeff;
  bool local_164;
  char local_148 [24];
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar9 = 0;
  if (0 < (p_lp->
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
    local_164 = !writeZeroCoefficients;
    i = 0;
    iVar7 = 0;
    do {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_b0,p_svec,i);
      if (local_b0.fpclass == cpp_dec_float_NaN) {
        bVar8 = false;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                  (&local_130,0,(type *)0x0);
        iVar1 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (&local_b0,&local_130);
        bVar8 = iVar1 == 0;
      }
      if (!(bool)(local_164 & bVar8)) {
        if (iVar7 == 0) {
          poVar3 = boost::multiprecision::operator<<
                             (p_output,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                        *)&local_b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          __s = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (p_lp,i,p_cnames,local_148);
          if (__s != (char *)0x0) {
            sVar2 = strlen(__s);
            goto LAB_001493c5;
          }
          _Var5 = (int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18);
LAB_001493f4:
          std::ios::clear(_Var5);
        }
        else {
          this = &local_b0;
          if (iVar7 * -0x33333333 + 0x19999999U < 0x33333333) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n\t",2);
          }
          if (local_b0.fpclass == cpp_dec_float_NaN) {
LAB_00149311:
            std::__ostream_insert<char,std::char_traits<char>>(p_output," + ",3);
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::
            cpp_dec_float<long_long>(&local_130,0,(type *)0x0);
            iVar1 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (this,&local_130);
            if (-1 < iVar1) goto LAB_00149311;
            std::__ostream_insert<char,std::char_traits<char>>(p_output," - ",3);
            pcVar6 = &local_130;
            for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
              (pcVar6->data)._M_elems[0] = (this->data)._M_elems[0];
              this = (cpp_dec_float<200U,_int,_void> *)((long)this + (ulong)bVar9 * -8 + 4);
              pcVar6 = (cpp_dec_float<200U,_int,_void> *)
                       ((long)pcVar6 + ((ulong)bVar9 * -2 + 1) * 4);
            }
            local_130.neg = local_b0.neg;
            if (local_b0.fpclass != cpp_dec_float_finite || local_130.data._M_elems[0] != 0) {
              local_130.neg = (bool)(local_b0.neg ^ 1);
            }
            this = &local_130;
          }
          boost::multiprecision::operator<<
                    (p_output,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)this);
          std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
          __s = getColName<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (p_lp,i,p_cnames,local_148);
          if (__s == (char *)0x0) {
            _Var5 = (int)p_output + (int)*(undefined8 *)(*(long *)p_output + -0x18);
            goto LAB_001493f4;
          }
          sVar2 = strlen(__s);
          poVar3 = p_output;
LAB_001493c5:
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
        }
        iVar7 = iVar7 + 1;
      }
      i = i + 1;
    } while (i < (p_lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum);
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<R>&   p_lp,                         ///< the LP
   std::ostream&         p_output,                     ///< output stream
   const NameSet*        p_cnames,                     ///< column names
   const SVectorBase<R>& p_svec,                       ///< vector to write
   const bool            writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns
         if(num_coeffs % SOPLEX_NUM_ENTRIES_PER_LINE == 0)
            p_output << "\n\t";

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}